

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
matrix_sparse_row_test_const_subscript_operators_Test::
matrix_sparse_row_test_const_subscript_operators_Test
          (matrix_sparse_row_test_const_subscript_operators_Test *this)

{
  matrix_sparse_row_test_const_subscript_operators_Test *this_local;
  
  matrix_sparse_row_test::matrix_sparse_row_test(&this->super_matrix_sparse_row_test);
  (this->super_matrix_sparse_row_test).super_Test._vptr_Test =
       (_func_int **)&PTR__matrix_sparse_row_test_const_subscript_operators_Test_001b9170;
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, const_subscript_operators) {
  const Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row[1], 3.0);
  EXPECT_DOUBLE_EQ(row[3], 4.0);
  EXPECT_DOUBLE_EQ(row[4], 5.0);
  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row[0], "./*");
  EXPECT_DEATH(remove_warning = row[2], "./*");
  EXPECT_DEATH(remove_warning = row[5], "./*");
}